

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eeep_parse.c
# Opt level: O3

void ParsePciEBifurcationBlock(PciEBifurcationBlock_t *dblock)

{
  byte bVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  char *pcVar5;
  char *pcVar6;
  PciELane_t *pPVar7;
  ulong uVar8;
  
  puts("   COM-HPC PCI-E Bifurcation block:");
  if (dblock->NrOfLaneDescriptors != '\0') {
    pPVar7 = dblock->LaneDescriptors;
    uVar2 = 0;
    do {
      uVar4 = (ulong)pPVar7->NrOfConfigurations;
      bVar1 = pPVar7->LaneCapabilities;
      pcVar3 = "; NVME";
      if ((bVar1 & 0x20) == 0) {
        pcVar3 = "";
      }
      pcVar5 = "; PEG";
      if ((bVar1 & 0x40) == 0) {
        pcVar5 = "";
      }
      pcVar6 = "; Target";
      if (-1 < (char)bVar1) {
        pcVar6 = "";
      }
      printf("      Lane %d: Gen%d%s%s%s\n",(ulong)pPVar7->LaneNumber,(ulong)(bVar1 & 0xf),pcVar3,
             pcVar5,pcVar6);
      printf("         Configurations: ");
      if (uVar4 != 0) {
        uVar8 = 0;
        do {
          pcVar3 = "(R)";
          if (-1 < (char)pPVar7->Configurations[uVar8]) {
            pcVar3 = "";
          }
          printf("%d%s ",(ulong)(pPVar7->Configurations[uVar8] & 0x3f),pcVar3);
          uVar8 = uVar8 + 1;
        } while (uVar4 != uVar8);
      }
      putchar(10);
      pPVar7 = (PciELane_t *)(pPVar7->Configurations + uVar4);
      uVar2 = uVar2 + 1;
    } while (uVar2 < dblock->NrOfLaneDescriptors);
  }
  return;
}

Assistant:

void ParsePciEBifurcationBlock(PciEBifurcationBlock_t *dblock)
{
    int idx1, idx2;
    PciELane_t *laneDescr = dblock->LaneDescriptors;
	printf("   COM-HPC PCI-E Bifurcation block:\n");
    for(idx1 = 0; idx1 < dblock->NrOfLaneDescriptors; idx1++) {
        int count2 = laneDescr->NrOfConfigurations;
        printf("      Lane %d: Gen%d%s%s%s\n", 
            laneDescr->LaneNumber, 
            laneDescr->LaneCapabilities & 0xF,
            laneDescr->LaneCapabilities & 0x20 ? "; NVME" : "",
            laneDescr->LaneCapabilities & 0x40 ? "; PEG" : "",
            laneDescr->LaneCapabilities & 0x80 ? "; Target" : "");
        printf("         Configurations: ");
        for(idx2 = 0; idx2 < count2; idx2++) {
            printf("%d%s ", 
                laneDescr->Configurations[idx2] & 0x3F,
                laneDescr->Configurations[idx2] & 0x80 ? "(R)" : ""); 
        }
        printf("\n");
        laneDescr = (PciELane_t *)((const char *)laneDescr + FIELD_OFFSET(PciELane_t, Configurations) + count2);
    }
}